

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

bool __thiscall
ON_PolynomialSurface::Create(ON_PolynomialSurface *this,int dim,bool is_rat,int order0,int order1)

{
  int iVar1;
  undefined7 in_register_00000011;
  long lVar2;
  int iVar3;
  ON_4dPoint *__s;
  
  iVar1 = 0;
  if (0 < dim) {
    iVar1 = dim;
  }
  this->m_dim = iVar1;
  iVar1 = 0;
  if (0 < order0) {
    iVar1 = order0;
  }
  this->m_is_rat = (int)CONCAT71(in_register_00000011,is_rat);
  iVar3 = 0;
  if (0 < order1) {
    iVar3 = order1;
  }
  this->m_order[0] = iVar1;
  this->m_order[1] = iVar3;
  ON_SimpleArray<ON_4dPoint>::SetCapacity
            (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,(ulong)(uint)(iVar3 * iVar1));
  if ((0 < this->m_order[0]) && (0 < this->m_order[1])) {
    __s = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
    lVar2 = (long)(this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_capacity;
    if (0 < lVar2) {
      memset(__s,0,lVar2 << 5);
      __s = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
    }
    __s->w = 1.0;
  }
  return (0 < dim && 0 < order0) && 0 < order1;
}

Assistant:

bool ON_PolynomialSurface::Create( int dim, bool is_rat, int order0, int order1 )
{
  bool rc = true;
  if ( dim > 0 ) m_dim = dim; else {m_dim = 0; rc = false;};
  m_is_rat = is_rat?1:0;
  if ( order0 > 0 ) m_order[0] = order0; else { m_order[0] = 0; rc = false;}
  if ( order1 > 0 ) m_order[1] = order1; else { m_order[1] = 0; rc = false;}
  m_cv.SetCapacity( m_order[0]*m_order[1] );
  if ( m_order[0] > 0 && m_order[1] > 0 ) {
    m_cv.Zero();
    m_cv[0].w = 1.0;
  }
  return rc;
}